

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O0

double filter_bessel(double x)

{
  double dVar1;
  double x_local;
  
  if ((x != 0.0) || (NAN(x))) {
    dVar1 = KernelBessel_Order1(x * 3.141592653589793);
    x_local = dVar1 / (x * 2.0);
  }
  else {
    x_local = 0.7853981633974483;
  }
  return x_local;
}

Assistant:

static double filter_bessel(const double x)
{
	if (x == 0.0f)
		return (double)(M_PI/4.0f);
	return (KernelBessel_Order1((double)M_PI*x)/(2.0f*x));
}